

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::StringSliceIter::finalize(StringSliceIter *this)

{
  Type local_20;
  
  if (((this->ref->type).id == 1) || ((this->num->type).id == 1)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression.type.id = 1;
  }
  else {
    wasm::Type::Type(&local_20,(HeapType)0x7,NonNullable);
    (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression.type.id =
         local_20.id;
  }
  return;
}

Assistant:

void StringSliceIter::finalize() {
  if (ref->type == Type::unreachable || num->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type(HeapType::string, NonNullable);
  }
}